

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation
          (ConflictPoolPropagation *this,ConflictPoolPropagation *other)

{
  HighsConflictPool *pHVar1;
  
  this->conflictpoolindex = other->conflictpoolindex;
  pHVar1 = other->conflictpool_;
  this->domain = other->domain;
  this->conflictpool_ = pHVar1;
  std::vector<int,_std::allocator<int>_>::vector(&this->colLowerWatched_,&other->colLowerWatched_);
  std::vector<int,_std::allocator<int>_>::vector(&this->colUpperWatched_,&other->colUpperWatched_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->conflictFlag_,&other->conflictFlag_);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->propagateConflictInds_,&other->propagateConflictInds_);
  std::
  vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  ::vector(&this->watchedLiterals_,&other->watchedLiterals_);
  HighsConflictPool::addPropagationDomain(this->conflictpool_,this);
  return;
}

Assistant:

HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation(
    const ConflictPoolPropagation& other)
    : conflictpoolindex(other.conflictpoolindex),
      domain(other.domain),
      conflictpool_(other.conflictpool_),
      colLowerWatched_(other.colLowerWatched_),
      colUpperWatched_(other.colUpperWatched_),
      conflictFlag_(other.conflictFlag_),
      propagateConflictInds_(other.propagateConflictInds_),
      watchedLiterals_(other.watchedLiterals_) {
  conflictpool_->addPropagationDomain(this);
}